

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::init
          (RandomSSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  int local_38;
  int ndx;
  undefined1 local_20 [4];
  int numBlocks;
  Random rnd;
  RandomSSBOLayoutCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,this->m_seed);
  iVar1 = de::Random::getInt((Random *)local_20,1,this->m_maxBlocks);
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    generateBlock(this,(Random *)local_20,0);
  }
  de::Random::~Random((Random *)local_20);
  return extraout_EAX;
}

Assistant:

void RandomSSBOLayoutCase::init (void)
{
	de::Random rnd(m_seed);

	const int numBlocks = rnd.getInt(1, m_maxBlocks);

	for (int ndx = 0; ndx < numBlocks; ndx++)
		generateBlock(rnd, 0);
}